

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSTable.cpp
# Opt level: O3

void __thiscall SSTable::SSTable(SSTable *this,path *filepath)

{
  char cVar1;
  undefined8 *puVar2;
  
  std::filesystem::__cxx11::path::path(&this->file);
  this->header = (SSTableHeader *)0x0;
  this->data = (SSTableData *)0x0;
  this->index = (SSTableIndex *)0x0;
  cVar1 = std::filesystem::status(filepath);
  if ((cVar1 != -1) && (cVar1 != '\0')) {
    std::filesystem::__cxx11::path::operator=(&this->file,filepath);
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = &PTR__exception_00110d58;
  __cxa_throw(puVar2,&SSTableFileNotExistsException::typeinfo,std::exception::~exception);
}

Assistant:

SSTable::SSTable(const path &filepath) {
    if (!exists(filepath)) {
        throw SSTableFileNotExistsException();
    }
    file = filepath;
}